

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::HlslParseContext::handleEntryPointAttributes
          (HlslParseContext *this,TSourceLoc *loc,TAttributes *attributes)

{
  TIntermediate *this_00;
  int dim;
  bool bVar1;
  int iVar2;
  pointer pTVar3;
  undefined4 extraout_var;
  size_type sVar4;
  const_reference ppTVar5;
  undefined4 extraout_var_00;
  TConstUnionArray *this_01;
  TConstUnion *this_02;
  char *pcVar6;
  int local_100;
  TVertexSpacing local_fc;
  int ctrlPoints;
  TVertexSpacing partitioning;
  TString partitionStr;
  TLayoutGeometry primitive;
  TVertexOrder vertexOrder;
  TString topologyStr;
  undefined1 local_98 [4];
  TLayoutGeometry domain;
  TString domainStr;
  TString pcfName;
  int local_40;
  int maxVertexCount;
  int invocations;
  int lid;
  TIntermSequence *sequence;
  _Self local_28;
  const_iterator it;
  TAttributes *attributes_local;
  TSourceLoc *loc_local;
  HlslParseContext *this_local;
  
  it._M_node = (_List_node_base *)attributes;
  local_28._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>::begin
                 (&attributes->
                   super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
                 );
  while( true ) {
    sequence = (TIntermSequence *)
               std::__cxx11::
               list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>::end
                         ((list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
                           *)it._M_node);
    bVar1 = std::operator!=(&local_28,(_Self *)&sequence);
    if (!bVar1) break;
    pTVar3 = std::_List_const_iterator<glslang::TAttributeArgs>::operator->(&local_28);
    switch(pTVar3->name) {
    case EatDomain:
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                   local_98);
      pTVar3 = std::_List_const_iterator<glslang::TAttributeArgs>::operator->(&local_28);
      bVar1 = TAttributeArgs::getString(pTVar3,(TString *)local_98,0,true);
      if (bVar1) {
        topologyStr.field_2._12_4_ = 0;
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                 *)local_98,"tri");
        if (bVar1) {
          topologyStr.field_2._12_4_ = 5;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                   *)local_98,"quad");
          if (bVar1) {
            topologyStr.field_2._12_4_ = 8;
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                     *)local_98,"isoline");
            if (bVar1) {
              topologyStr.field_2._12_4_ = 9;
            }
            else {
              pcVar6 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                       c_str((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                              *)local_98);
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                        (this,loc,"unsupported domain type",pcVar6,"");
            }
          }
        }
        if ((this->super_TParseContextBase).super_TParseVersions.language == EShLangTessEvaluation)
        {
          bVar1 = TIntermediate::setInputPrimitive
                            ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                             topologyStr.field_2._12_4_);
          if (!bVar1) {
            pcVar6 = TQualifier::getGeometryString(topologyStr.field_2._12_4_);
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,loc,"cannot change previously set domain",pcVar6,"");
          }
        }
        else {
          bVar1 = TIntermediate::setOutputPrimitive
                            ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                             topologyStr.field_2._12_4_);
          if (!bVar1) {
            pcVar6 = TQualifier::getGeometryString(topologyStr.field_2._12_4_);
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,loc,"cannot change previously set domain",pcVar6,"");
          }
        }
      }
      else {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"invalid domain","");
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                    local_98);
      break;
    case EatEarlyDepthStencil:
      TIntermediate::setEarlyFragmentTests
                ((this->super_TParseContextBase).super_TParseVersions.intermediate);
      break;
    default:
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                (this,loc,"attribute does not apply to entry point","");
      break;
    case EatInstance:
      pTVar3 = std::_List_const_iterator<glslang::TAttributeArgs>::operator->(&local_28);
      bVar1 = TAttributeArgs::getInt(pTVar3,&local_40,0);
      if (bVar1) {
        bVar1 = TIntermediate::setInvocations
                          ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                           local_40);
        if (!bVar1) {
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,"cannot change previously set instance attribute","");
        }
      }
      else {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"invalid instance","");
      }
      break;
    case EatNumThreads:
      pTVar3 = std::_List_const_iterator<glslang::TAttributeArgs>::operator->(&local_28);
      iVar2 = (*(pTVar3->args->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                _vptr_TIntermNode[0x33])();
      _invocations = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                     CONCAT44(extraout_var,iVar2);
      for (maxVertexCount = 0; iVar2 = maxVertexCount,
          sVar4 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::size
                            (_invocations), dim = maxVertexCount, iVar2 < (int)sVar4;
          maxVertexCount = maxVertexCount + 1) {
        this_00 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        ppTVar5 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                            (_invocations,(long)maxVertexCount);
        iVar2 = (*(*ppTVar5)->_vptr_TIntermNode[5])();
        this_01 = TIntermConstantUnion::getConstArray
                            ((TIntermConstantUnion *)CONCAT44(extraout_var_00,iVar2));
        this_02 = TConstUnionArray::operator[](this_01,0);
        iVar2 = TConstUnion::getIConst(this_02);
        TIntermediate::setLocalSize(this_00,dim,iVar2);
      }
      break;
    case EatMaxVertexCount:
      pTVar3 = std::_List_const_iterator<glslang::TAttributeArgs>::operator->(&local_28);
      bVar1 = TAttributeArgs::getInt(pTVar3,(int *)(pcfName.field_2._M_local_buf + 0xc),0);
      if (bVar1) {
        bVar1 = TIntermediate::setVertices
                          ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                           pcfName.field_2._12_4_);
        if (!bVar1) {
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,"cannot change previously set maxvertexcount attribute","");
        }
      }
      else {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"invalid maxvertexcount","");
      }
      break;
    case EatOutputControlPoints:
      pTVar3 = std::_List_const_iterator<glslang::TAttributeArgs>::operator->(&local_28);
      bVar1 = TAttributeArgs::getInt(pTVar3,&local_100,0);
      if (bVar1) {
        bVar1 = TIntermediate::setVertices
                          ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                           local_100);
        if (!bVar1) {
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,"cannot change previously set outputcontrolpoints attribute","");
        }
      }
      else {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"invalid outputcontrolpoints","");
      }
      break;
    case EatOutputTopology:
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                   &primitive);
      pTVar3 = std::_List_const_iterator<glslang::TAttributeArgs>::operator->(&local_28);
      bVar1 = TAttributeArgs::getString(pTVar3,(TString *)&primitive,0,true);
      if (bVar1) {
        partitionStr.field_2._12_4_ = 0;
        partitionStr.field_2._8_4_ = 0;
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                 *)&primitive,"point");
        if (bVar1) {
          TIntermediate::setPointMode
                    ((this->super_TParseContextBase).super_TParseVersions.intermediate);
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                   *)&primitive,"line");
          if (bVar1) {
            partitionStr.field_2._8_4_ = 9;
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                     *)&primitive,"triangle_cw");
            if (bVar1) {
              partitionStr.field_2._12_4_ = 1;
              partitionStr.field_2._8_4_ = 5;
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                       *)&primitive,"triangle_ccw");
              if (bVar1) {
                partitionStr.field_2._12_4_ = 2;
                partitionStr.field_2._8_4_ = 5;
              }
              else {
                pcVar6 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         ::c_str((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                  *)&primitive);
                (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                          (this,loc,"unsupported outputtopology type",pcVar6,"");
              }
            }
          }
        }
        if ((partitionStr.field_2._12_4_ != 0) &&
           (bVar1 = TIntermediate::setVertexOrder
                              ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                               partitionStr.field_2._12_4_), !bVar1)) {
          pcVar6 = TQualifier::getVertexOrderString(partitionStr.field_2._12_4_);
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,"cannot change previously set outputtopology",pcVar6,"");
        }
        if (partitionStr.field_2._8_4_ != 0) {
          TIntermediate::setOutputPrimitive
                    ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                     partitionStr.field_2._8_4_);
        }
      }
      else {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"invalid outputtopology","");
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                    &primitive);
      break;
    case EatPartitioning:
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                   &ctrlPoints);
      pTVar3 = std::_List_const_iterator<glslang::TAttributeArgs>::operator->(&local_28);
      bVar1 = TAttributeArgs::getString(pTVar3,(TString *)&ctrlPoints,0,true);
      if (bVar1) {
        local_fc = EvsNone;
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                 *)&ctrlPoints,"integer");
        if (bVar1) {
          local_fc = EvsEqual;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                   *)&ctrlPoints,"fractional_even");
          if (bVar1) {
            local_fc = EvsFractionalEven;
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                     *)&ctrlPoints,"fractional_odd");
            if (bVar1) {
              local_fc = EvsFractionalOdd;
            }
            else {
              pcVar6 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                       c_str((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                              *)&ctrlPoints);
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                        (this,loc,"unsupported partitioning type",pcVar6,"");
            }
          }
        }
        bVar1 = TIntermediate::setVertexSpacing
                          ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                           local_fc);
        if (!bVar1) {
          pcVar6 = TQualifier::getVertexSpacingString(local_fc);
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,"cannot change previously set partitioning",pcVar6,"");
        }
      }
      else {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"invalid partitioning","");
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                    &ctrlPoints);
      break;
    case EatPatchConstantFunc:
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                   ((long)&domainStr.field_2 + 8));
      pTVar3 = std::_List_const_iterator<glslang::TAttributeArgs>::operator->(&local_28);
      bVar1 = TAttributeArgs::getString(pTVar3,(TString *)((long)&domainStr.field_2 + 8),0,false);
      if (bVar1) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        operator=(&this->patchConstantFunctionName,
                  (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                  ((long)&domainStr.field_2 + 8));
      }
      else {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"invalid patch constant function","");
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                    ((long)&domainStr.field_2 + 8));
      break;
    case EatLocation:
    case EatBuiltIn:
    }
    std::_List_const_iterator<glslang::TAttributeArgs>::operator++(&local_28);
  }
  return;
}

Assistant:

void HlslParseContext::handleEntryPointAttributes(const TSourceLoc& loc, const TAttributes& attributes)
{
    for (auto it = attributes.begin(); it != attributes.end(); ++it) {
        switch (it->name) {
        case EatNumThreads:
        {
            const TIntermSequence& sequence = it->args->getSequence();
            for (int lid = 0; lid < int(sequence.size()); ++lid)
                intermediate.setLocalSize(lid, sequence[lid]->getAsConstantUnion()->getConstArray()[0].getIConst());
            break;
        }
        case EatInstance: 
        {
            int invocations;

            if (!it->getInt(invocations)) {
                error(loc, "invalid instance", "", "");
            } else {
                if (!intermediate.setInvocations(invocations))
                    error(loc, "cannot change previously set instance attribute", "", "");
            }
            break;
        }
        case EatMaxVertexCount:
        {
            int maxVertexCount;

            if (! it->getInt(maxVertexCount)) {
                error(loc, "invalid maxvertexcount", "", "");
            } else {
                if (! intermediate.setVertices(maxVertexCount))
                    error(loc, "cannot change previously set maxvertexcount attribute", "", "");
            }
            break;
        }
        case EatPatchConstantFunc:
        {
            TString pcfName;
            if (! it->getString(pcfName, 0, false)) {
                error(loc, "invalid patch constant function", "", "");
            } else {
                patchConstantFunctionName = pcfName;
            }
            break;
        }
        case EatDomain:
        {
            // Handle [domain("...")]
            TString domainStr;
            if (! it->getString(domainStr)) {
                error(loc, "invalid domain", "", "");
            } else {
                TLayoutGeometry domain = ElgNone;

                if (domainStr == "tri") {
                    domain = ElgTriangles;
                } else if (domainStr == "quad") {
                    domain = ElgQuads;
                } else if (domainStr == "isoline") {
                    domain = ElgIsolines;
                } else {
                    error(loc, "unsupported domain type", domainStr.c_str(), "");
                }

                if (language == EShLangTessEvaluation) {
                    if (! intermediate.setInputPrimitive(domain))
                        error(loc, "cannot change previously set domain", TQualifier::getGeometryString(domain), "");
                } else {
                    if (! intermediate.setOutputPrimitive(domain))
                        error(loc, "cannot change previously set domain", TQualifier::getGeometryString(domain), "");
                }
            }
            break;
        }
        case EatOutputTopology:
        {
            // Handle [outputtopology("...")]
            TString topologyStr;
            if (! it->getString(topologyStr)) {
                error(loc, "invalid outputtopology", "", "");
            } else {
                TVertexOrder vertexOrder = EvoNone;
                TLayoutGeometry primitive = ElgNone;

                if (topologyStr == "point") {
                    intermediate.setPointMode();
                } else if (topologyStr == "line") {
                    primitive = ElgIsolines;
                } else if (topologyStr == "triangle_cw") {
                    vertexOrder = EvoCw;
                    primitive = ElgTriangles;
                } else if (topologyStr == "triangle_ccw") {
                    vertexOrder = EvoCcw;
                    primitive = ElgTriangles;
                } else {
                    error(loc, "unsupported outputtopology type", topologyStr.c_str(), "");
                }

                if (vertexOrder != EvoNone) {
                    if (! intermediate.setVertexOrder(vertexOrder)) {
                        error(loc, "cannot change previously set outputtopology",
                              TQualifier::getVertexOrderString(vertexOrder), "");
                    }
                }
                if (primitive != ElgNone)
                    intermediate.setOutputPrimitive(primitive);
            }
            break;
        }
        case EatPartitioning:
        {
            // Handle [partitioning("...")]
            TString partitionStr;
            if (! it->getString(partitionStr)) {
                error(loc, "invalid partitioning", "", "");
            } else {
                TVertexSpacing partitioning = EvsNone;

                if (partitionStr == "integer") {
                    partitioning = EvsEqual;
                } else if (partitionStr == "fractional_even") {
                    partitioning = EvsFractionalEven;
                } else if (partitionStr == "fractional_odd") {
                    partitioning = EvsFractionalOdd;
                    //} else if (partition == "pow2") { // TODO: currently nothing to map this to.
                } else {
                    error(loc, "unsupported partitioning type", partitionStr.c_str(), "");
                }

                if (! intermediate.setVertexSpacing(partitioning))
                    error(loc, "cannot change previously set partitioning",
                          TQualifier::getVertexSpacingString(partitioning), "");
            }
            break;
        }
        case EatOutputControlPoints:
        {
            // Handle [outputcontrolpoints("...")]
            int ctrlPoints;
            if (! it->getInt(ctrlPoints)) {
                error(loc, "invalid outputcontrolpoints", "", "");
            } else {
                if (! intermediate.setVertices(ctrlPoints)) {
                    error(loc, "cannot change previously set outputcontrolpoints attribute", "", "");
                }
            }
            break;
        }
        case EatEarlyDepthStencil:
            intermediate.setEarlyFragmentTests();
            break;
        case EatBuiltIn:
        case EatLocation:
            // tolerate these because of dual use of entrypoint and type attributes
            break;
        default:
            warn(loc, "attribute does not apply to entry point", "", "");
            break;
        }
    }
}